

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.cpp
# Opt level: O1

void luaO_chunkid(char *out,char *source,size_t bufflen)

{
  long lVar1;
  size_t __n;
  char *pcVar2;
  char *pcVar3;
  ulong __n_00;
  ulong uVar4;
  
  __n = strlen(source);
  if (*source == '@') {
    if (bufflen < __n) {
      out[2] = '.';
      out[0] = '.';
      out[1] = '.';
      out = out + 3;
      lVar1 = __n - bufflen;
      __n = bufflen - 3;
      pcVar2 = source + lVar1 + 4;
      goto LAB_0010ad34;
    }
  }
  else {
    if (*source != '=') {
      pcVar2 = strchr(source,10);
      builtin_strncpy(out,"[string \"",9);
      pcVar3 = out + 9;
      uVar4 = bufflen - 0xf;
      if (pcVar2 == (char *)0x0 && __n < uVar4) {
        memcpy(pcVar3,source,__n);
        pcVar3 = pcVar3 + __n;
      }
      else {
        __n_00 = (long)pcVar2 - (long)source;
        if (pcVar2 == (char *)0x0) {
          __n_00 = __n;
        }
        if (uVar4 <= __n_00) {
          __n_00 = uVar4;
        }
        memcpy(pcVar3,source,__n_00);
        pcVar2 = pcVar3 + __n_00;
        pcVar3 = pcVar2 + 3;
        pcVar2[0] = '.';
        pcVar2[1] = '.';
        pcVar2[2] = '.';
      }
      pcVar3[2] = '\0';
      pcVar3[0] = '\"';
      pcVar3[1] = ']';
      return;
    }
    if (bufflen < __n) {
      memcpy(out,source + 1,bufflen - 1);
      out[bufflen - 1] = '\0';
      return;
    }
  }
  pcVar2 = source + 1;
LAB_0010ad34:
  memcpy(out,pcVar2,__n);
  return;
}

Assistant:

void luaO_chunkid (char *out, const char *source, size_t bufflen) {
  size_t l = strlen(source);
  if (*source == '=') {  /* 'literal' source */
    if (l <= bufflen)  /* small enough? */
      memcpy(out, source + 1, l * sizeof(char));
    else {  /* truncate it */
      addstr(out, source + 1, bufflen - 1);
      *out = '\0';
    }
  }
  else if (*source == '@') {  /* file name */
    if (l <= bufflen)  /* small enough? */
      memcpy(out, source + 1, l * sizeof(char));
    else {  /* add '...' before rest of name */
      addstr(out, RETS, LL(RETS));
      bufflen -= LL(RETS);
      memcpy(out, source + 1 + l - bufflen, bufflen * sizeof(char));
    }
  }
  else {  /* string; format as [string "source"] */
    const char *nl = strchr(source, '\n');  /* find first new line (if any) */
    addstr(out, PRE, LL(PRE));  /* add prefix */
    bufflen -= LL(PRE RETS POS) + 1;  /* save space for prefix+suffix+'\0' */
    if (l < bufflen && nl == NULL) {  /* small one-line source? */
      addstr(out, source, l);  /* keep it */
    }
    else {
      if (nl != NULL) l = nl - source;  /* stop at first newline */
      if (l > bufflen) l = bufflen;
      addstr(out, source, l);
      addstr(out, RETS, LL(RETS));
    }
    memcpy(out, POS, (LL(POS) + 1) * sizeof(char));
  }
}